

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_emptyEncapsulation_Test::~Parser_emptyEncapsulation_Test
          (Parser_emptyEncapsulation_Test *this)

{
  Parser_emptyEncapsulation_Test *this_local;
  
  ~Parser_emptyEncapsulation_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, emptyEncapsulation)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <encapsulation/>\n"
        "</model>\n";

    const std::vector<std::string> expectedIssues = {
        "Encapsulation in model 'model_name' does not contain any child elements.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
    EXPECT_EQ(libcellml::Issue::Level::WARNING, p->issue(0)->level());
}